

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
ImmediatePromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
destroy(ImmediatePromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
        *this)

{
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
  ~ExceptionOr(&this->result);
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }